

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_open_input_string_op(sexp ctx,sexp self,sexp_sint_t n,sexp str)

{
  sexp psVar1;
  
  if ((((ulong)str & 3) == 0) && (str->tag == 9)) {
    psVar1 = sexp_make_input_port(ctx,(FILE *)0x0,(sexp)&DAT_0000003e);
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      (psVar1->value).type.cpl = str;
      (psVar1->value).type.setters =
           (sexp)((((str->value).type.cpl)->value).flonum_bits +
                 (long)(((str->value).type.name)->value).flonum_bits);
      (psVar1->value).type.print = (sexp)0x0;
      (psVar1->value).port.size = (size_t)(str->value).type.slots;
      (psVar1->value).flonum_bits[0x2a] = '\0';
    }
    return psVar1;
  }
  psVar1 = sexp_type_exception(ctx,self,9,str);
  return psVar1;
}

Assistant:

sexp sexp_open_input_string_op (sexp ctx, sexp self, sexp_sint_t n, sexp str) {
  sexp res;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  res = sexp_make_input_port(ctx, NULL, SEXP_FALSE);
  if (sexp_exceptionp(res)) return res;
  sexp_port_cookie(res) = str;
  sexp_port_buf(res) = sexp_string_data(str);
  sexp_port_offset(res) = 0;
  sexp_port_size(res) = sexp_string_size(str);
  sexp_port_binaryp(res) = 0;
  return res;
}